

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVector<int,_2U>::SmallVector(SmallVector<int,_2U> *this,initializer_list<int> IL)

{
  initializer_list<int> IL_00;
  size_type in_RDX;
  iterator in_RSI;
  SmallVectorImpl<int> *in_RDI;
  uint in_stack_ffffffffffffffbc;
  SmallVectorImpl<int> *in_stack_ffffffffffffffd0;
  
  SmallVectorImpl<int>::SmallVectorImpl(in_RDI,in_stack_ffffffffffffffbc);
  IL_00._M_len = in_RDX;
  IL_00._M_array = in_RSI;
  SmallVectorImpl<int>::assign(in_stack_ffffffffffffffd0,IL_00);
  return;
}

Assistant:

SmallVector(std::initializer_list<T> IL) : SmallVectorImpl<T>(N) {
    this->assign(IL);
  }